

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTryTableExpr
          (BinaryReaderInterp *this,Type sig_type,CatchClauseVector *catches)

{
  Offset OVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  char *pcVar6;
  string_view *psVar7;
  Result RVar8;
  Offset fixup_offset;
  Offset OVar9;
  TypeVector *pTVar10;
  Enum EVar11;
  Index catch_drop_count_00;
  pointer pCVar12;
  bool bVar13;
  u32 exn_stack_height;
  Index catch_drop_count;
  Label *vlabel;
  Location loc;
  Index local_1c4;
  string_view *local_1c0;
  TypeChecker *local_1b8;
  SharedValidator *local_1b0;
  Location local_1a8;
  HandlerDesc local_188;
  Type local_150;
  size_t local_148;
  pointer local_140;
  undefined1 local_138 [8];
  char *pcStack_130;
  anon_union_16_2_ecfd7102_for_Location_1 local_128 [4];
  TableCatch local_e8;
  
  local_1b0 = &this->validator_;
  local_e8.loc.field_1.field_0.last_column = 0;
  local_e8.loc.filename._M_len = (this->filename_)._M_len;
  pcVar6 = (this->filename_)._M_str;
  local_e8.loc.filename._M_str._0_4_ = SUB84(pcVar6,0);
  local_e8.loc.filename._M_str._4_4_ = (undefined4)((ulong)pcVar6 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_e8.loc.field_1.field_0.line = (int)OVar1;
  local_e8.loc.field_1.field_0.first_column = (int)(OVar1 >> 0x20);
  RVar8 = SharedValidator::BeginTryTable(local_1b0,&local_e8.loc,sig_type);
  EVar11 = Error;
  if (RVar8.enum_ != Error) {
    local_1b8 = &(this->validator_).typechecker_;
    RVar8 = TypeChecker::GetCatchCount
                      (local_1b8,
                       (int)((ulong)((long)(this->label_stack_).
                                           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->label_stack_).
                                          super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1,
                       &local_1c4);
    EVar11 = Error;
    if (RVar8.enum_ != Error) {
      local_1c0 = &this->filename_;
      local_188.values =
           (int)((ulong)((long)(this->validator_).typechecker_.type_stack_.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->validator_).typechecker_.type_stack_.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) + this->local_count_;
      local_188.kind = Catch;
      local_188.try_start_offset = 0xffffffff;
      local_188.try_end_offset = 0xffffffff;
      local_188.catches.
      super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.catches.
      super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
      super__Vector_impl_data._M_finish = (CatchDesc *)0x0;
      local_188.catches.
      super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (CatchDesc *)0x0;
      local_188.field_4.catch_all_offset = 0xffffffff;
      local_188.exceptions = local_1c4;
      local_188.catch_all_ref = false;
      local_150 = sig_type;
      Istream::Emit(this->istream_,Br);
      fixup_offset = Istream::EmitFixupU32(this->istream_);
      pCVar12 = (catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      local_140 = (catches->
                  super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>)._M_impl
                  .super__Vector_impl_data._M_finish;
      if (pCVar12 != local_140) {
        bVar13 = false;
        do {
          local_e8.loc.field_1.field_0.line = 0;
          local_e8.loc.field_1.field_0.first_column = 0;
          local_e8.loc.field_1.field_0.last_column = 0;
          local_e8.loc.filename._M_len = 0;
          local_e8.loc.filename._M_str._0_4_ = 0;
          local_e8.loc.filename._M_str._4_4_ = 0;
          Var::Var(&local_e8.tag);
          Var::Var(&local_e8.target);
          psVar7 = local_1c0;
          local_e8.kind = pCVar12->kind;
          local_1a8.field_1.field_0.last_column = 0;
          local_1a8.filename._M_len = local_1c0->_M_len;
          local_1a8.filename._M_str = local_1c0->_M_str;
          local_1a8.field_1.field_1.offset =
               (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
               ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
          Var::Var((Var *)local_138,pCVar12->tag,&local_1a8);
          Var::operator=(&local_e8.tag,(Var *)local_138);
          Var::~Var((Var *)local_138);
          local_1a8.field_1.field_0.last_column = 0;
          local_1a8.filename._M_len = psVar7->_M_len;
          local_1a8.filename._M_str = psVar7->_M_str;
          local_1a8.field_1.field_1.offset =
               (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
               ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
          Var::Var((Var *)local_138,pCVar12->depth,&local_1a8);
          Var::operator=(&local_e8.target,(Var *)local_138);
          Var::~Var((Var *)local_138);
          local_128[0].field_0.last_column = 0;
          local_138 = (undefined1  [8])psVar7->_M_len;
          pcStack_130 = psVar7->_M_str;
          local_128[0]._0_8_ =
               ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
          RVar8 = SharedValidator::OnTryTableCatch(local_1b0,(Location *)local_138,&local_e8);
          if (RVar8.enum_ == Error) {
LAB_001b508b:
            Var::~Var(&local_e8.target);
            Var::~Var(&local_e8.tag);
            EVar11 = Error;
            goto LAB_001b50aa;
          }
          if (!bVar13) {
            bVar13 = (local_e8.kind & ~CatchRef) == CatchAll;
            if (bVar13) {
              local_188.catch_all_ref = (bool)((byte)local_e8.kind & 1);
              local_188.field_4.catch_all_offset = Istream::end(this->istream_);
            }
            else {
              local_138._0_4_ = pCVar12->tag;
              OVar9 = Istream::end(this->istream_);
              local_138._4_4_ = OVar9;
              pcStack_130 = (char *)CONCAT71(pcStack_130._1_7_,
                                             (local_e8.kind & ~CatchAll) == CatchRef);
              pcVar6 = pcStack_130;
              if (local_188.catches.
                  super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_188.catches.
                  super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
                _M_realloc_insert<wabt::interp::CatchDesc>
                          (&local_188.catches,
                           (iterator)
                           local_188.catches.
                           super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(CatchDesc *)local_138);
              }
              else {
                (local_188.catches.
                 super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->ref = pcStack_130._0_1_;
                *(undefined3 *)
                 &(local_188.catches.
                   super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->field_0x9 = pcStack_130._1_3_;
                (local_188.catches.
                 super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->tag_index = local_138._0_4_;
                (local_188.catches.
                 super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->offset = OVar9;
                local_188.catches.
                super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_188.catches.
                     super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                pcStack_130 = pcVar6;
              }
            }
            RVar8 = TypeChecker::GetLabel(local_1b8,pCVar12->depth,(Label **)local_138);
            if (RVar8.enum_ != Error) {
              pTVar10 = (TypeVector *)((long)local_138 + 0x20);
              if (*(LabelType *)local_138 == Loop) {
                pTVar10 = (TypeVector *)((long)local_138 + 8);
              }
              pTVar2 = (pTVar10->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pTVar3 = (pTVar10->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              pTVar4 = (this->validator_).typechecker_.type_stack_.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pTVar5 = (this->validator_).typechecker_.type_stack_.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              local_148 = *(size_t *)((long)local_138 + 0x38);
              RVar8 = TypeChecker::GetCatchCount(local_1b8,pCVar12->depth,(Index *)&local_1a8);
              if (RVar8.enum_ != Error) {
                catch_drop_count_00 = (int)local_1a8.filename._M_len + 1;
                local_1a8.filename._M_len =
                     CONCAT44(local_1a8.filename._M_len._4_4_,catch_drop_count_00);
                EmitBr(this,pCVar12->depth,
                       (int)((ulong)((long)pTVar5 - (long)pTVar4) >> 3) - (int)local_148,
                       (Index)((ulong)((long)pTVar3 - (long)pTVar2) >> 3),catch_drop_count_00);
                Var::~Var(&local_e8.target);
                Var::~Var(&local_e8.tag);
                goto LAB_001b4fc4;
              }
            }
            goto LAB_001b508b;
          }
          Var::~Var(&local_e8.target);
          Var::~Var(&local_e8.tag);
          bVar13 = true;
LAB_001b4fc4:
          pCVar12 = pCVar12 + 1;
        } while (pCVar12 != local_140);
      }
      local_e8.loc.field_1.field_0.last_column = 0;
      local_e8.loc.filename._M_len = local_1c0->_M_len;
      local_e8.loc.filename._M_str._0_4_ = SUB84(local_1c0->_M_str,0);
      local_e8.loc.filename._M_str._4_4_ = (undefined4)((ulong)local_1c0->_M_str >> 0x20);
      OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      local_e8.loc.field_1.field_0.line = (int)OVar1;
      local_e8.loc.field_1.field_0.first_column = (int)(OVar1 >> 0x20);
      RVar8 = SharedValidator::EndTryTable(local_1b0,&local_e8.loc,local_150);
      EVar11 = Error;
      if (RVar8.enum_ != Error) {
        OVar9 = Istream::end(this->istream_);
        local_188.try_start_offset = OVar9;
        PushLabel(this,Try,0xffffffff,0xffffffff,
                  (int)((ulong)((long)(this->func_->handlers).
                                      super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->func_->handlers).
                                     super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249)
        ;
        std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
        emplace_back<wabt::interp::HandlerDesc>(&this->func_->handlers,&local_188);
        Istream::ResolveFixupU32(this->istream_,fixup_offset);
        EVar11 = Ok;
      }
LAB_001b50aa:
      if (local_188.catches.
          super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.catches.
                        super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_188.catches.
                              super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.catches.
                              super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return (Result)EVar11;
}

Assistant:

Result BinaryReaderInterp::OnTryTableExpr(Type sig_type,
                                          const CatchClauseVector& catches) {
  // we can just emit the catch handlers beforehand, so long as we skip over
  // them when entering the try.
  CHECK_RESULT(validator_.BeginTryTable(GetLocation(), sig_type));

  u32 exn_stack_height;
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &exn_stack_height));
  // NOTE: *NOT* GetLocalCount. we don't count the parameters, as they're not
  // part of the frame.
  u32 value_stack_height = validator_.type_stack_size() + local_count_;

  HandlerDesc desc =
      HandlerDesc{HandlerKind::Catch,        Istream::kInvalidOffset,
                  Istream::kInvalidOffset,   {},
                  {Istream::kInvalidOffset}, value_stack_height,
                  exn_stack_height};

  istream_.Emit(Opcode::Br);
  auto offset = istream_.EmitFixupU32();

  bool has_catch_all = false;
  for (const auto& raw_catch : catches) {
    TableCatch catch_;
    catch_.kind = raw_catch.kind;
    catch_.tag = Var(raw_catch.tag, GetLocation());
    catch_.target = Var(raw_catch.depth, GetLocation());
    CHECK_RESULT(validator_.OnTryTableCatch(GetLocation(), catch_));
    // stop emitting handlers after catch_all - but we must still validate the
    // handlers we don't emit
    if (has_catch_all) {
      continue;
    }
    if (catch_.IsCatchAll()) {
      has_catch_all = true;
      desc.catch_all_ref = catch_.IsRef();
      desc.catch_all_offset = istream_.end();
    } else {
      desc.catches.push_back(
          CatchDesc{raw_catch.tag, istream_.end(), catch_.IsRef()});
    }
    // we can't use GetBrDropKeepCount because we're not in a real block.
    SharedValidator::Label* vlabel;
    CHECK_RESULT(validator_.GetLabel(raw_catch.depth, &vlabel));
    // we keep the exception's results.
    // (this has already been validated, above)
    Index keep_count = vlabel->br_types().size();
    // we drop everything between the current block and the br target.
    // (we have already taken the TryTable block parameters into account, in
    // BeginTryTable)
    Index drop_count = validator_.type_stack_size() - vlabel->type_stack_limit;
    Index catch_drop_count;
    // we use the regular catch count
    CHECK_RESULT(validator_.GetCatchCount(raw_catch.depth, &catch_drop_count));
    // but increment, as we are semantically in a catch
    catch_drop_count++;
    EmitBr(raw_catch.depth, drop_count, keep_count, catch_drop_count);
  }

  CHECK_RESULT(validator_.EndTryTable(GetLocation(), sig_type));

  desc.try_start_offset = istream_.end();

  // as usual, the label is pushed after the catch handlers
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset,
            func_->handlers.size());
  func_->handlers.push_back(std::move(desc));

  istream_.ResolveFixupU32(offset);

  return Result::Ok;
}